

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

ByteData *
cfd::core::Psbt::CreateRecordKey(ByteData *__return_storage_ptr__,uint8_t type,ByteData *key_bytes)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ByteData::ByteData((ByteData *)&local_28,type);
  ByteData::Serialize((ByteData *)&local_40,key_bytes);
  ByteData::Concat<cfd::core::ByteData>
            (__return_storage_ptr__,(ByteData *)&local_28,(ByteData *)&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateRecordKey(uint8_t type, const ByteData &key_bytes) {
  return ByteData(type).Concat(key_bytes.Serialize());
}